

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HPreData.cpp
# Opt level: O2

void __thiscall HPreData::printSolution(HPreData *this)

{
  ostream *poVar1;
  int iVar2;
  ulong uVar3;
  char buff [10];
  
  poVar1 = std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  std::operator<<(poVar1,"Col value: ");
  iVar2 = 0;
  uVar3 = 0;
  while( true ) {
    if ((long)this->numColOriginal <= (long)uVar3) break;
    sprintf(buff,"%2.2f ",
            (this->valuePrimal).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[uVar3],(uVar3 & 0xffffffff) % 0x1e);
    *(undefined8 *)(malloc + *(long *)(std::cout + -0x18)) = 5;
    std::operator<<((ostream *)&std::cout,buff);
    if ((int)((uVar3 & 0xffffffff) / 0x1e) * 0x1e + iVar2 == 0) {
      std::ostream::flush();
    }
    uVar3 = uVar3 + 1;
    iVar2 = iVar2 + -1;
  }
  poVar1 = std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  std::endl<char,std::char_traits<char>>(poVar1);
  return;
}

Assistant:

void HPreData::printSolution() {
	char buff [10];
    cout<<endl<<"Col value: ";
    for (int i=0;i<numColOriginal;i++) {
    	sprintf(buff, "%2.2f ", valuePrimal[i]);
    	cout<<setw(5)<<buff;
    	if ((i%30) == 0)
    		cout<<std::flush;
    	}

    cout<<endl<<endl;
}